

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboTestUtil::Texture2DArrayShader::Texture2DArrayShader
          (Texture2DArrayShader *this,DataType samplerType,DataType outputType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int i;
  ShaderProgramDeclaration *pSVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  long *local_460;
  long local_458;
  long local_450;
  long lStack_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  long *local_420;
  long local_418;
  long local_410;
  long lStack_408;
  long *local_400;
  long local_3f8;
  long local_3f0;
  long lStack_3e8;
  long *local_3e0;
  long local_3d8;
  long local_3d0;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  long *local_3c0;
  long local_3b8;
  long local_3b0 [2];
  long *local_3a0;
  long local_398;
  long local_390 [2];
  long *local_380;
  long local_378;
  long local_370 [2];
  long *local_360;
  long local_358;
  long local_350 [2];
  long *local_340;
  long local_338;
  long local_330 [2];
  long *local_320;
  long local_318;
  long local_310 [2];
  long *local_300;
  long local_2f8;
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  VertexSource local_2a0;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  FragmentOutput local_25c;
  Uniform local_258;
  Uniform local_230;
  Uniform local_208;
  Uniform local_1e0;
  VertexAttribute local_1b8;
  VertexAttribute local_190;
  FragmentSource local_168;
  VertexToFragmentVarying local_148;
  ShaderProgramDeclaration local_140;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"a_position","");
  local_190.name._M_dataplus._M_p = (pointer)&local_190.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_300,local_2f8 + (long)local_300);
  local_190.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_190);
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"a_coord","");
  local_1b8.name._M_dataplus._M_p = (pointer)&local_1b8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_320,local_318 + (long)local_320);
  local_1b8.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1b8);
  local_148.type = GENERICVECTYPE_FLOAT;
  local_148.flatshade = false;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_148);
  if (outputType == TYPE_FLOAT_VEC4) {
    local_25c.type = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    local_25c.type = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    local_25c.type = GENERICVECTYPE_INT32;
  }
  else {
    local_25c.type = GENERICVECTYPE_LAST;
  }
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_25c);
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"u_sampler0","");
  local_1e0.name._M_dataplus._M_p = (pointer)&local_1e0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_340,local_338 + (long)local_340);
  local_1e0.type = samplerType;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1e0);
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"u_scale","");
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_360,local_358 + (long)local_360);
  local_208.type = TYPE_FLOAT_VEC4;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_208);
  local_380 = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"u_bias","");
  local_230.name._M_dataplus._M_p = (pointer)&local_230.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_380,local_378 + (long)local_380);
  local_230.type = TYPE_FLOAT_VEC4;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_230);
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"u_layer","");
  local_258.name._M_dataplus._M_p = (pointer)&local_258.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_3a0,local_398 + (long)local_3a0);
  local_258.type = TYPE_INT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_258);
  local_3c0 = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c0,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,"");
  local_2a0.source._M_dataplus._M_p = (pointer)&local_2a0.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_3c0,local_3b8 + (long)local_3c0);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_2a0);
  local_2e0[0] = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_2e0);
  local_460 = &local_450;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_450 = *plVar5;
    lStack_448 = plVar3[3];
  }
  else {
    local_450 = *plVar5;
    local_460 = (long *)*plVar3;
  }
  local_458 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  glu::getDataTypeName(samplerType);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_420 = &local_410;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_410 = *plVar5;
    lStack_408 = plVar3[3];
  }
  else {
    local_410 = *plVar5;
    local_420 = (long *)*plVar3;
  }
  local_418 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_420);
  local_440 = &local_430;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_430 = *plVar5;
    lStack_428 = plVar3[3];
  }
  else {
    local_430 = *plVar5;
    local_440 = (long *)*plVar3;
  }
  local_438 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  glu::getDataTypeName(outputType);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_440);
  local_400 = &local_3f0;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_3f0 = *plVar5;
    lStack_3e8 = plVar3[3];
  }
  else {
    local_3f0 = *plVar5;
    local_400 = (long *)*plVar3;
  }
  local_3f8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_400);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_2b0 = *plVar5;
    lStack_2a8 = plVar3[3];
    local_2c0 = &local_2b0;
  }
  else {
    local_2b0 = *plVar5;
    local_2c0 = (long *)*plVar3;
  }
  local_2b8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  glu::getDataTypeName(outputType);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_270 = *plVar5;
    lStack_268 = plVar3[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *plVar5;
    local_280 = (long *)*plVar3;
  }
  local_278 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_280);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_3d0 = *plVar5;
    uStack_3c8 = (undefined4)plVar3[3];
    uStack_3c4 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_3e0 = &local_3d0;
  }
  else {
    local_3d0 = *plVar5;
    local_3e0 = (long *)*plVar3;
  }
  local_3d8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  paVar1 = &local_168.source.field_2;
  local_168.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,local_3e0,local_3d8 + (long)local_3e0);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_168);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.source._M_dataplus._M_p,
                    local_168.source.field_2._M_allocated_capacity + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0 + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440,local_430 + 1);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420,local_410 + 1);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  if (local_2e0[0] != local_2d0) {
    operator_delete(local_2e0[0],local_2d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.source._M_dataplus._M_p != &local_2a0.source.field_2) {
    operator_delete(local_2a0.source._M_dataplus._M_p,
                    local_2a0.source.field_2._M_allocated_capacity + 1);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0,local_3b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.name._M_dataplus._M_p != &local_258.name.field_2) {
    operator_delete(local_258.name._M_dataplus._M_p,local_258.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0,local_390[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.name._M_dataplus._M_p != &local_230.name.field_2) {
    operator_delete(local_230.name._M_dataplus._M_p,local_230.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,local_208.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.name._M_dataplus._M_p != &local_1e0.name.field_2) {
    operator_delete(local_1e0.name._M_dataplus._M_p,local_1e0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.name._M_dataplus._M_p != &local_1b8.name.field_2) {
    operator_delete(local_1b8.name._M_dataplus._M_p,local_1b8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_320 != local_310) {
    operator_delete(local_320,local_310[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.name._M_dataplus._M_p != &local_190.name.field_2) {
    operator_delete(local_190.name._M_dataplus._M_p,local_190.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300,local_2f0[0] + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00d39fe0;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00d3a018;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00d3a030;
  lVar4 = 0;
  do {
    *(undefined4 *)((long)(&this->m_texBias + -1) + lVar4 * 4) = 0x3f800000;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  (this->m_texBias).m_data[0] = 0.0;
  (this->m_texBias).m_data[1] = 0.0;
  (this->m_texBias).m_data[2] = 0.0;
  (this->m_texBias).m_data[3] = 0.0;
  this->m_layer = 0;
  this->m_outputType = outputType;
  return;
}

Assistant:

Texture2DArrayShader::Texture2DArrayShader (glu::DataType samplerType, glu::DataType outputType)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
							<< sglr::pdec::Uniform("u_sampler0", samplerType)
							<< sglr::pdec::Uniform("u_scale", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_bias", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_layer", glu::TYPE_INT)
							<< sglr::pdec::VertexSource(
									"#version 300 es\n"
									"in highp vec4 a_position;\n"
									"in highp vec2 a_coord;\n"
									"out highp vec2 v_coord;\n"
									"void main (void)\n"
									"{\n"
									"	gl_Position = a_position;\n"
									"	v_coord = a_coord;\n"
									"}\n")
							<< sglr::pdec::FragmentSource(
									string("") +
									"#version 300 es\n"
									"uniform highp " + glu::getDataTypeName(samplerType) + " u_sampler0;\n"
									"uniform highp vec4 u_scale;\n"
									"uniform highp vec4 u_bias;\n"
									"uniform highp int u_layer;\n"
									"in highp vec2 v_coord;\n"
									"layout(location = 0) out highp " + glu::getDataTypeName(outputType) + " o_color;\n"
									"void main (void)\n"
									"{\n"
									"	o_color = " + glu::getDataTypeName(outputType) + "(vec4(texture(u_sampler0, vec3(v_coord, u_layer))) * u_scale + u_bias);\n"
									"}\n"))
	, m_texScale	(1.0f)
	, m_texBias		(0.0f)
	, m_layer		(0)
	, m_outputType	(outputType)
{
}